

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O1

vector<Section_*,_std::allocator<Section_*>_> *
get_sections_by_input_blob
          (vector<Section_*,_std::allocator<Section_*>_> *__return_storage_ptr__,
          deque<Section_*,_std::allocator<Section_*>_> *dnet,string *blob)

{
  pointer *pppSVar1;
  pointer pbVar2;
  pointer pcVar3;
  iterator __position;
  int iVar4;
  pointer pbVar5;
  Section *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  _Map_pointer local_78;
  _Elt_pointer local_70;
  Section *local_68;
  _Elt_pointer local_60;
  _Elt_pointer local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_60 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (local_58 != local_60) {
    local_70 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_78 = (dnet->super__Deque_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      local_68 = *local_58;
      pbVar2 = (local_68->input_blobs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = (local_68->input_blobs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1
          ) {
        pcVar3 = (pbVar5->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + pbVar5->_M_string_length);
        if (local_48 == blob->_M_string_length) {
          if (local_48 != 0) {
            iVar4 = bcmp(local_50,(blob->_M_dataplus)._M_p,local_48);
            if (iVar4 != 0) goto LAB_001046f5;
          }
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<Section_*,_std::allocator<Section_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Section*,std::allocator<Section*>>::_M_realloc_insert<Section*const&>
                      ((vector<Section*,std::allocator<Section*>> *)__return_storage_ptr__,
                       __position,&local_68);
          }
          else {
            *__position._M_current = local_68;
            pppSVar1 = &(__return_storage_ptr__->
                        super__Vector_base<Section_*,_std::allocator<Section_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
        }
LAB_001046f5:
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
      }
      local_58 = local_58 + 1;
      if (local_58 == local_70) {
        local_58 = local_78[1];
        local_78 = local_78 + 1;
        local_70 = local_58 + 0x40;
      }
    } while (local_58 != local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Section*> get_sections_by_input_blob(std::deque<Section*>& dnet, std::string blob)
{
    std::vector<Section*> ret;
    for (auto s : dnet)
        for (auto b : s->input_blobs)
            if (b == blob)
                ret.push_back(s);
    return ret;
}